

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edge_impl.hpp
# Opt level: O0

void __thiscall
xmotion::
Graph<std::shared_ptr<xmotion::StateExample>,_double,_xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>_>_>
::Edge::PrintEdge(Edge *this)

{
  ostream *poVar1;
  Vertex *pVVar2;
  int64_t iVar3;
  long in_RDI;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"Edge_t: src - ");
  pVVar2 = vertex_iterator::operator->((vertex_iterator *)0x104cc5);
  iVar3 = Vertex::GetVertexID(pVVar2);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,iVar3);
  poVar1 = std::operator<<(poVar1," , dst - ");
  pVVar2 = vertex_iterator::operator->((vertex_iterator *)0x104cfc);
  iVar3 = Vertex::GetVertexID(pVVar2);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,iVar3);
  poVar1 = std::operator<<(poVar1," , cost - ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(double *)(in_RDI + 0x10));
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void Graph<State, Transition, StateIndexer>::Edge::PrintEdge() {
  std::cout << "Edge_t: src - " << src->GetVertexID() << " , dst - "
            << dst->GetVertexID() << " , cost - " << cost << std::endl;
}